

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::~I64ToI32Lowering(I64ToI32Lowering *this)

{
  ~I64ToI32Lowering(this);
  operator_delete(this,600);
  return;
}

Assistant:

bool addsEffects() override { return true; }